

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O0

void __thiscall Js::SharedContents::AddAgent(SharedContents *this,DWORD_PTR agent)

{
  HeapAllocator *alloc;
  List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_00;
  TrackAllocData local_48;
  AutoCriticalSection local_20;
  AutoCriticalSection autoCS;
  DWORD_PTR agent_local;
  SharedContents *this_local;
  
  autoCS.cs = (CriticalSection *)agent;
  AutoCriticalSection::AutoCriticalSection(&local_20,&this->csAgent);
  if (this->allowedAgents == (SharableAgents *)0x0) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,
               (type_info *)
               &JsUtil::
                List<unsigned_long,Memory::HeapAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/SharedArrayBuffer.cpp"
               ,0xf);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_48);
    this_00 = (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)new<Memory::HeapAllocator>(0x30,alloc,0x350bd0);
    JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::List(this_00,&Memory::HeapAllocator::Instance,4);
    this->allowedAgents = this_00;
  }
  JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  Add(this->allowedAgents,(unsigned_long *)&autoCS);
  AutoCriticalSection::~AutoCriticalSection(&local_20);
  return;
}

Assistant:

void SharedContents::AddAgent(DWORD_PTR agent)
    {
        AutoCriticalSection autoCS(&csAgent);
        if (allowedAgents == nullptr)
        {
            allowedAgents = HeapNew(SharableAgents, &HeapAllocator::Instance);
        }

        allowedAgents->Add(agent);
    }